

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O2

string * loadRandomImage(string *path)

{
  uint uVar1;
  result_type rVar2;
  difference_type dVar3;
  string *psVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> _Stack_2808;
  directory_iterator local_27f8;
  directory_iterator local_27e8;
  directory_iterator local_27d8;
  string s;
  path local_27a0;
  directory_iterator __end1;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_2768;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_2750;
  uniform_int_distribution<int> intgen;
  random_device rd;
  mt19937 gen;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&rd,in_RSI,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_27f8,(path *)&rd);
  local_27d8._M_dir._M_ptr = (element_type *)0x0;
  local_27d8._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dVar3 = std::
          count_if<std::filesystem::__cxx11::directory_iterator,bool(*)(std::filesystem::__cxx11::path_const&)>
                    (&local_27f8,&local_27d8,std::filesystem::is_regular_file);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_27d8._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_27f8._M_dir._M_refcount);
  std::filesystem::__cxx11::path::~path((path *)&rd);
  std::random_device::random_device(&rd);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar1);
  intgen._M_param._M_b = (int)dVar3 + -1;
  intgen._M_param._M_a = 0;
  rVar2 = std::uniform_int_distribution<int>::operator()(&intgen,&gen);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_27a0,in_RSI,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&_Stack_2808,&local_27a0);
  std::filesystem::__cxx11::path::~path(&local_27a0);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2768,&_Stack_2808);
  local_27e8._M_dir._M_ptr = local_2768._M_ptr;
  local_27e8._M_dir._M_refcount._M_pi = local_2768._M_refcount._M_pi;
  local_2768._M_ptr = (element_type *)0x0;
  local_2768._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2768._M_refcount);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2750,&_Stack_2808);
  __end1._M_dir._M_ptr = (element_type *)0x0;
  __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2750._M_refcount);
  iVar5 = rVar2 + 1;
  do {
    if (local_27e8._M_dir._M_refcount._M_pi == __end1._M_dir._M_refcount._M_pi) {
LAB_00106b6e:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_27e8._M_dir._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_2808._M_refcount);
      cv::imread((string *)path,(int)&s);
      std::__cxx11::string::~string((string *)&s);
      std::random_device::~random_device(&rd);
      return path;
    }
    psVar4 = (string *)std::filesystem::__cxx11::directory_iterator::operator*(&local_27e8);
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      std::__cxx11::string::string((string *)&local_27a0,psVar4);
      std::__cxx11::string::operator=((string *)&s,(string *)&local_27a0);
      std::__cxx11::string::~string((string *)&local_27a0);
      goto LAB_00106b6e;
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_27e8);
  } while( true );
}

Assistant:

cv::Mat loadRandomImage(string path) {
    using fp = bool (*)(const filesystem::path&);
    auto nfiles = count_if(filesystem::directory_iterator(path), filesystem::directory_iterator{}, (fp)filesystem::is_regular_file);
    random_device rd;  
    mt19937 gen(rd());
    uniform_int_distribution<> intgen(0, nfiles-1);
    auto n = intgen(gen);
    int i=0;
    string s;
    for (const auto & file: filesystem::directory_iterator(path)) {
        if (i == n) {
            s = file.path();
            break;
        }
        i++;
    }
    auto back = cv::imread(s);
    return back;
}